

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.h
# Opt level: O0

string * __thiscall
wabt::cat<char[2],char_const*>
          (string *__return_storage_ptr__,wabt *this,char (*args) [2],char **args_1)

{
  char **args_local_1;
  char (*args_local) [2];
  string *s;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  cat_compute_size<char[2],char_const*>((char (*) [2])this,(char **)args);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  cat_concatenate<char[2],char_const*>(__return_storage_ptr__,(char (*) [2])this,(char **)args);
  return __return_storage_ptr__;
}

Assistant:

std::string cat(const Ts&... args) {
    std::string s;
    s.reserve(cat_compute_size(args...));
    cat_concatenate(s, args...);
    return s;
}